

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::on_piece_verified
          (torrent *this,vector<sha256_hash> *block_hashes,piece_index_t piece,sha1_hash *piece_hash
          ,storage_error *error)

{
  pointer pdVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  tribool tVar5;
  uint uVar6;
  undefined4 extraout_var;
  sha1_hash *psVar7;
  char *pcVar8;
  char *pcVar9;
  char cVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  string_view job_name;
  span<const_libtorrent::digest32<256L>_> block_hashes_00;
  unique_lock<std::mutex> local_88;
  uint local_78;
  undefined1 local_68 [16];
  pointer local_58;
  sha1_hash local_44;
  
  if (((this->super_torrent_hot_members).field_0x4b & 4) != 0) {
    return;
  }
  if ((this->field_0x5e0 & 4) != 0) {
    return;
  }
  psVar7 = piece_hash;
  piece_picker::completed_hash_job
            ((this->super_torrent_hot_members).m_picker._M_t.
             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,piece);
  iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  local_88._M_device = (mutex_type *)(CONCAT44(extraout_var,iVar4) + 0x438);
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  ::std::unique_lock<std::mutex>::lock(&local_88);
  local_88._M_owns = true;
  uVar6 = *(uint *)(CONCAT44(extraout_var,iVar4) + 0x428);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_88);
  tVar5.value = true_value;
  cVar10 = '\x01';
  if ((uVar6 >> 0x16 & 1) == 0) {
    if ((error->ec).val_ == 0) {
      bVar2 = digest32<160L>::is_all_zeros
                        (&(((this->super_torrent_hot_members).m_torrent_file.
                            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->m_info_hash).v1);
      tVar5.value = indeterminate_value;
      cVar10 = '\x02';
      if (!bVar2) {
        local_78 = (piece_hash->m_number)._M_elems[4];
        local_88._M_device = *(mutex_type **)(piece_hash->m_number)._M_elems;
        local_88._8_8_ = *(undefined8 *)((piece_hash->m_number)._M_elems + 2);
        torrent_info::hash_for_piece
                  (&local_44,
                   (this->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   piece);
        auVar16[0] = -((char)local_78 == (char)local_44.m_number._M_elems[4]);
        auVar16[1] = -((char)(local_78 >> 8) == (char)(local_44.m_number._M_elems[4] >> 8));
        auVar16[2] = -((char)(local_78 >> 0x10) == (char)(local_44.m_number._M_elems[4] >> 0x10));
        auVar16[3] = -((char)(local_78 >> 0x18) == (char)(local_44.m_number._M_elems[4] >> 0x18));
        auVar16[4] = 0xff;
        auVar16[5] = 0xff;
        auVar16[6] = 0xff;
        auVar16[7] = 0xff;
        auVar16[8] = 0xff;
        auVar16[9] = 0xff;
        auVar16[10] = 0xff;
        auVar16[0xb] = 0xff;
        auVar16[0xc] = 0xff;
        auVar16[0xd] = 0xff;
        auVar16[0xe] = 0xff;
        auVar16[0xf] = 0xff;
        auVar15[0] = -((char)local_44.m_number._M_elems[0] == (char)local_88._M_device);
        auVar15[1] = -(local_44.m_number._M_elems[0]._1_1_ == local_88._M_device._1_1_);
        auVar15[2] = -(local_44.m_number._M_elems[0]._2_1_ == local_88._M_device._2_1_);
        auVar15[3] = -(local_44.m_number._M_elems[0]._3_1_ == local_88._M_device._3_1_);
        auVar15[4] = -((char)local_44.m_number._M_elems[1] == local_88._M_device._4_1_);
        auVar15[5] = -(local_44.m_number._M_elems[1]._1_1_ == local_88._M_device._5_1_);
        auVar15[6] = -(local_44.m_number._M_elems[1]._2_1_ == local_88._M_device._6_1_);
        auVar15[7] = -(local_44.m_number._M_elems[1]._3_1_ == local_88._M_device._7_1_);
        auVar15[8] = -((bool)(char)local_44.m_number._M_elems[2] == local_88._M_owns);
        auVar15[9] = -(local_44.m_number._M_elems[2]._1_1_ == local_88._9_1_);
        auVar15[10] = -(local_44.m_number._M_elems[2]._2_1_ == local_88._10_1_);
        auVar15[0xb] = -(local_44.m_number._M_elems[2]._3_1_ == local_88._11_1_);
        auVar15[0xc] = -((char)local_44.m_number._M_elems[3] == local_88._12_1_);
        auVar15[0xd] = -(local_44.m_number._M_elems[3]._1_1_ == local_88._13_1_);
        auVar15[0xe] = -(local_44.m_number._M_elems[3]._2_1_ == local_88._14_1_);
        auVar15[0xf] = -(local_44.m_number._M_elems[3]._3_1_ == local_88._15_1_);
        auVar15 = auVar15 & auVar16;
        cVar10 = (ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff;
      }
      pdVar1 = (block_hashes->
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ).
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pdVar1 != (block_hashes->
                    super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    ).
                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        block_hashes_00.m_len = (difference_type)psVar7;
        block_hashes_00.m_ptr = pdVar1;
        tVar5 = on_blocks_hashed(this,piece,block_hashes_00);
      }
      goto LAB_0031a9c8;
    }
    bVar13 = true;
    bVar14 = false;
    bVar12 = true;
    bVar11 = false;
    bVar2 = false;
LAB_0031a9f6:
    bVar3 = (bool)(bVar13 & bVar11 & ((bVar14 | bVar12) ^ 1U));
  }
  else {
LAB_0031a9c8:
    bVar2 = (error->ec).val_ == 0;
    bVar11 = tVar5.value == true_value;
    bVar12 = tVar5.value == false_value;
    bVar13 = cVar10 == '\0';
    bVar14 = cVar10 == '\x01';
    if (bVar13 || bVar11) goto LAB_0031a9f6;
    bVar3 = cVar10 == '\x01' && tVar5.value == false_value;
  }
  if ((bVar2) && (bVar3)) {
    handle_inconsistent_hashes(this,piece);
    return;
  }
  if (bVar14) {
    if (bVar2 || !bVar12) goto LAB_0031aa41;
LAB_0031aa57:
    bVar2 = true;
    job_name._M_str = "piece_verified";
    job_name._M_len = 0xe;
    handle_disk_error(this,job_name,error,(peer_connection *)0x0,none);
  }
  else {
    if (!bVar2 && (bVar13 | bVar12) == 0xff) goto LAB_0031aa57;
LAB_0031aa41:
    bVar2 = false;
  }
  iVar4 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
  if ((char)iVar4 != '\0') {
    uVar6 = file_storage::piece_size
                      (&((this->super_torrent_hot_members).m_torrent_file.
                         super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->m_files,piece);
    bVar3 = bVar12;
    if (!bVar14) {
      bVar3 = (bool)(bVar13 | bVar12);
    }
    pcVar8 = "-";
    if (bVar3) {
      pcVar8 = "failed";
    }
    bVar3 = bVar11;
    if (!bVar13) {
      bVar3 = (bool)(bVar14 | bVar11);
    }
    pcVar9 = "disk failed";
    if (!bVar2) {
      pcVar9 = pcVar8;
    }
    pcVar8 = "passed";
    if (bVar3 == false) {
      pcVar8 = pcVar9;
    }
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** PIECE_FINISHED [ p: %d | chk: %s | size: %d ]",(ulong)(uint)piece.m_val,
               pcVar8,(ulong)uVar6);
  }
  if (((this->super_torrent_hot_members).m_picker._M_t.
       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
       ._M_t.
       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl ==
       (piece_picker *)0x0) && (((this->super_torrent_hot_members).field_0x4b & 0x40) != 0)) {
    return;
  }
  need_picker(this);
  state_updated(this);
  bVar3 = piece_picker::is_piece_finished
                    ((this->super_torrent_hot_members).m_picker._M_t.
                     super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                     .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                     piece);
  if (!bVar3) {
    return;
  }
  if (bVar2) {
    update_gauge(this);
    return;
  }
  if (bVar13) {
    if (bVar11) {
LAB_0031ab6c:
      piece_passed(this,piece);
      if ((this->field_0x5cc & 4) == 0) {
        return;
      }
      verified(this,piece);
      return;
    }
  }
  else if (bVar11 || bVar14) goto LAB_0031ab6c;
  if (bVar14) {
    if (!bVar12) {
      return;
    }
  }
  else if (!bVar13 && !bVar12) {
    return;
  }
  local_68 = (undefined1  [16])0x0;
  local_58 = (pointer)0x0;
  piece_failed(this,piece,(vector<int,_std::allocator<int>_> *)local_68);
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._0_8_,(long)local_58 - local_68._0_8_);
  }
  return;
}

Assistant:

void torrent::on_piece_verified(aux::vector<sha256_hash> block_hashes
		, piece_index_t const piece
		, sha1_hash const& piece_hash, storage_error const& error) try
	{
		TORRENT_ASSERT(is_single_thread());

		if (m_abort) return;
		if (m_deleted) return;

		m_picker->completed_hash_job(piece);

		boost::tribool passed = boost::indeterminate;
		boost::tribool v2_passed = boost::indeterminate;

		if (settings().get_bool(settings_pack::disable_hash_checks))
		{
			passed = v2_passed = true;
		}
		else if (error)
		{
			passed = v2_passed = false;
		}
		else
		{
			if (torrent_file().info_hashes().has_v1())
			{
				passed = sha1_hash(piece_hash) == m_torrent_file->hash_for_piece(piece);
			}

			if (!block_hashes.empty())
			{
				TORRENT_ASSERT(torrent_file().info_hashes().has_v2());
				v2_passed = on_blocks_hashed(piece, block_hashes);
			}
		}

		if (!error && ((passed && !v2_passed) || (!passed && v2_passed)))
		{
			handle_inconsistent_hashes(piece);
			return;
		}

		bool const disk_error = (!passed || !v2_passed) && error;

		if (disk_error) handle_disk_error("piece_verified", error);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("*** PIECE_FINISHED [ p: %d | chk: %s | size: %d ]"
				, static_cast<int>(piece)
				, (passed || v2_passed) ? "passed"
				: disk_error ? "disk failed"
				: (!passed || !v2_passed) ? "failed"
				: "-"
				, m_torrent_file->piece_size(piece));
		}
#endif
		TORRENT_ASSERT(valid_metadata());

		// if we're a seed we don't have a picker
		// and we also don't have to do anything because
		// we already have this piece
		if (!has_picker() && m_have_all) return;

		need_picker();

		TORRENT_ASSERT(!m_picker->have_piece(piece));

		state_updated();

		// even though the piece passed the hash-check
		// it might still have failed being written to disk
		// if so, piece_picker::write_failed() has been
		// called, and the piece is no longer finished.
		// in this case, we have to ignore the fact that
		// it passed the check
		if (!m_picker->is_piece_finished(piece)) return;

		if (disk_error)
		{
			update_gauge();
		}
		else if (passed || v2_passed)
		{
			// the following call may cause picker to become invalid
			// in case we just became a seed
			piece_passed(piece);
			// if we're in seed mode, we just acquired this piece
			// mark it as verified
			if (m_seed_mode) verified(piece);
		}
		else if (!passed || !v2_passed)
		{
			// piece_failed() will restore the piece
			piece_failed(piece);
		}
	}
	catch (...) { handle_exception(); }